

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O1

void __thiscall libtorrent::dht::dht_tracker::stop(dht_tracker *this)

{
  service_type *psVar1;
  _Rb_tree_node_base *p_Var2;
  
  this->m_running = false;
  if ((this->m_key_refresh_timer).impl_.implementation_.might_have_pending_waits == true) {
    psVar1 = (this->m_key_refresh_timer).impl_.service_;
    boost::asio::detail::epoll_reactor::
    cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
              (psVar1->scheduler_,&psVar1->timer_queue_,
               &(this->m_key_refresh_timer).impl_.implementation_.timer_data,0xffffffffffffffff);
    (this->m_key_refresh_timer).impl_.implementation_.might_have_pending_waits = false;
  }
  for (p_Var2 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var2)) {
    if ((char)p_Var2[0x17]._M_color == _S_black) {
      boost::asio::detail::epoll_reactor::
      cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                ((epoll_reactor *)p_Var2[0x16]._M_left[2]._M_right,
                 (timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>
                  *)&p_Var2[0x16]._M_left[1]._M_parent,(per_timer_data *)&p_Var2[0x17]._M_parent,
                 0xffffffffffffffff);
      *(undefined1 *)&p_Var2[0x17]._M_color = _S_red;
    }
  }
  if ((this->m_refresh_timer).impl_.implementation_.might_have_pending_waits == true) {
    psVar1 = (this->m_refresh_timer).impl_.service_;
    boost::asio::detail::epoll_reactor::
    cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
              (psVar1->scheduler_,&psVar1->timer_queue_,
               &(this->m_refresh_timer).impl_.implementation_.timer_data,0xffffffffffffffff);
    (this->m_refresh_timer).impl_.implementation_.might_have_pending_waits = false;
  }
  ::std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::
  reset<void,boost::asio::detail::socket_ops::noop_deleter>
            ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)
             &(this->m_host_resolver).impl_.implementation_,0);
  return;
}

Assistant:

void dht_tracker::stop()
	{
		m_running = false;
		m_key_refresh_timer.cancel();
		for (auto& n : m_nodes)
			n.second.connection_timer.cancel();
		m_refresh_timer.cancel();
		m_host_resolver.cancel();
	}